

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O0

long _computeNumberOperation<long,long>(TokenType type,long x,long y)

{
  allocator<char> local_49;
  string local_48;
  long local_28;
  long y_local;
  long x_local;
  long lStack_10;
  TokenType type_local;
  
  switch(type) {
  case TOK_OP_ADD:
    lStack_10 = x + y;
    break;
  case TOK_OP_SUB:
    lStack_10 = x - y;
    break;
  default:
    local_28 = y;
    y_local = x;
    x_local._6_2_ = type;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Unknown operation",&local_49);
    pfederc::fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_optimizer.cpp"
                   ,0x8b,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    lStack_10 = 0;
    break;
  case TOK_OP_MUL:
    lStack_10 = x * y;
    break;
  case TOK_OP_DIV:
    lStack_10 = x / y;
  }
  return lStack_10;
}

Assistant:

static R _computeNumberOperation(TokenType type, T x, T y) noexcept {
	switch (type) {
	case TokenType::TOK_OP_ADD:
		return static_cast<R>(x + y);
  case TokenType::TOK_OP_SUB:
		return static_cast<R>(x - y);
  case TokenType::TOK_OP_MUL:
		return static_cast<R>(x * y);
  case TokenType::TOK_OP_DIV:
		return static_cast<R>(x / y);
	default:
		fatal(__FILE__, __LINE__, "Unknown operation");
		return 0;
	}
}